

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,long,duckdb::BinaryStandardOperatorWrapper,duckdb::InstrAsciiOperator,bool,false,false>
               (string_t *ldata,string_t *rdata,long *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  ulong uVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  string_t needle;
  string_t needle_00;
  string_t needle_01;
  string_t haystack;
  string_t haystack_00;
  string_t haystack_01;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  undefined8 in_stack_ffffffffffffff98;
  long *plVar12;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  idx_t iVar13;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    lVar4 = 0;
    while (bVar11 = count != 0, count = count - 1, bVar11) {
      haystack_01.value.pointer.ptr = (char *)in_stack_ffffffffffffffb0;
      haystack_01.value._0_8_ = in_stack_ffffffffffffffa8;
      needle_01.value.pointer.ptr = (char *)result_data;
      needle_01.value._0_8_ = in_stack_ffffffffffffff98;
      lVar6 = InstrAsciiOperator::Operation<duckdb::string_t,duckdb::string_t,long>
                        (haystack_01,needle_01);
      *(long *)((long)result_data + lVar4) = lVar6;
      lVar4 = lVar4 + 8;
    }
  }
  else {
    uVar1 = count + 0x3f;
    uVar9 = 0;
    iVar13 = count;
    for (uVar7 = 0; uVar7 != uVar1 >> 6; uVar7 = uVar7 + 1) {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar10 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar10 = count;
        }
LAB_01e94ed8:
        for (; uVar5 = uVar9, plVar12 = result_data, uVar9 < uVar10; uVar9 = uVar9 + 1) {
          haystack.value.pointer.ptr = (char *)iVar13;
          haystack.value._0_8_ = rdata;
          needle.value.pointer.ptr = (char *)result_data;
          needle.value._0_8_ = uVar7;
          lVar4 = InstrAsciiOperator::Operation<duckdb::string_t,duckdb::string_t,long>
                            (haystack,needle);
          result_data[uVar9] = lVar4;
        }
      }
      else {
        uVar3 = puVar2[uVar7];
        uVar10 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar10 = count;
        }
        if (uVar3 == 0xffffffffffffffff) goto LAB_01e94ed8;
        uVar5 = uVar10;
        plVar12 = result_data;
        if (uVar3 != 0) {
          count = iVar13;
          for (uVar8 = 0; uVar5 = uVar8 + uVar9, iVar13 = count, uVar8 + uVar9 < uVar10;
              uVar8 = uVar8 + 1) {
            if ((uVar3 >> (uVar8 & 0x3f) & 1) != 0) {
              haystack_00.value.pointer.ptr = (char *)count;
              haystack_00.value._0_8_ = rdata;
              needle_00.value.pointer.ptr = (char *)plVar12;
              needle_00.value._0_8_ = uVar7;
              lVar4 = InstrAsciiOperator::Operation<duckdb::string_t,duckdb::string_t,long>
                                (haystack_00,needle_00);
              result_data[uVar9 + uVar8] = lVar4;
            }
          }
        }
      }
      uVar9 = uVar5;
      result_data = plVar12;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}